

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O1

void XPMP2::SoundCleanup(void)

{
  if (gpSndSys != (long *)0x0) {
    (**(code **)(*gpSndSys + 8))();
    gpSndSys = (long *)0x0;
    if (glob < 1) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
             ,0x420,"SoundCleanup",logDEBUG,"Sound system shut down");
    }
  }
  DAT_002ef790 = 0;
  return;
}

Assistant:

void SoundCleanup ()
{
    // Remove the sound system
    if (gpSndSys) {
        delete gpSndSys;
        gpSndSys = nullptr;
        LOG_MSG(logDEBUG, "Sound system shut down");
    }
    glob.bSoundAvail = false;
}